

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifres(bifcxdef *ctx,int argc)

{
  runcxdef *prVar1;
  voccxdef *vctx;
  runsdef *prVar2;
  objnum objn;
  
  prVar1 = ctx->bifcxrun;
  vctx = prVar1->runcxvoc;
  objn = 0xffff;
  if (argc == 2) {
    prVar2 = prVar1->runcxsp;
    prVar1->runcxsp = prVar2 + -1;
    if (prVar2[-1].runstyp != '\n') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3f3);
    }
    objn = (ctx->bifcxrun->runcxsp->runsv).runsvobj;
  }
  objulose(vctx->voccxundo);
  vocrevert(vctx);
  vocdmnclr(vctx);
  vctx->voccxme = vctx->voccxme_init;
  if (vctx->voccxpreinit != 0xffff) {
    runfn(ctx->bifcxrun,vctx->voccxpreinit,0);
  }
  if (objn != 0xffff) {
    runfn(ctx->bifcxrun,objn,1);
  }
  errsigf(ctx->bifcxerr,"TADS",0x3fa);
}

Assistant:

void bifres(bifcxdef *ctx, int argc)
{
    voccxdef *vctx = ctx->bifcxrun->runcxvoc;
    objnum    fn;

    if (argc == 2)
        fn = runpopfn(ctx->bifcxrun);            /* get function if present */
    else
    {
        bifcntargs(ctx, 0, argc);        /* check for proper argument count */
        fn = MCMONINV;                         /* no function was specified */
    }

    objulose(vctx->voccxundo);                /* blow away all undo records */
    vocrevert(vctx);                /* revert all objects to original state */
    vocdmnclr(vctx);                   /* clear out fuses/deamons/notifiers */

    /* restore the original "Me" object */
    vctx->voccxme = vctx->voccxme_init;

    /* call preinit if necessary (call it before invoking the user callback) */
    if (vctx->voccxpreinit != MCMONINV)
        runfn(ctx->bifcxrun, vctx->voccxpreinit, 0);

    /*
     *   If a restart function was provided, call it.  Note that we left
     *   the argument for the function on the stack, so there's no need to
     *   re-push it!  
     */
    if (fn != MCMONINV) runfn(ctx->bifcxrun, fn, 1);

    /* restart the game */
    errsig(ctx->bifcxerr, ERR_RUNRESTART);
}